

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageLoadStoreTests.cpp
# Opt level: O2

long __thiscall glcts::anon_unknown_0::BasicAllTargetsLoadFS::Run(BasicAllTargetsLoadFS *this)

{
  bool bVar1;
  Vector<float,_4> *in_R8;
  GLenum in_R9D;
  long lVar2;
  undefined8 local_28;
  undefined8 uStack_20;
  
  bVar1 = ShaderImageLoadStoreBase::IsVSFSAvailable(&this->super_ShaderImageLoadStoreBase,0,4);
  lVar2 = 0x10;
  if (bVar1) {
    bVar1 = ShaderImageLoadStoreBase::IsSSBInVSFSAvailable(&this->super_ShaderImageLoadStoreBase,4);
    if (bVar1) {
      ShaderImageLoadStoreBase::CreateFullViewportQuad
                (&this->super_ShaderImageLoadStoreBase,&this->m_vao,&this->m_vbo,(GLuint *)0x0);
      local_28 = 0x41200000bf800000;
      uStack_20 = 0x453b8000c3480000;
      bVar1 = glcts::(anonymous_namespace)::BasicAllTargetsLoadFS::Read<tcu::Vector<float,4>>
                        ((BasicAllTargetsLoadFS *)this,0,(GLenum)&local_28,
                         (Vector<float,_4> *)&stack0xffffffffffffffc8,in_R8,in_R9D,0xbf800000);
      lVar2 = -1;
      if (bVar1) {
        local_28 = 0xaffffffff;
        uStack_20 = 0xbb8ffffff38;
        bVar1 = glcts::(anonymous_namespace)::BasicAllTargetsLoadFS::Read<tcu::Vector<int,4>>
                          ((BasicAllTargetsLoadFS *)this,0,(GLenum)&local_28,
                           (Vector<int,_4> *)&stack0xffffffffffffffc8,(Vector<int,_4> *)in_R8,in_R9D
                           ,0xffffffff);
        if (bVar1) {
          local_28 = 0xa00000001;
          uStack_20 = 0xbb8000000c8;
          bVar1 = glcts::(anonymous_namespace)::BasicAllTargetsLoadFS::
                  Read<tcu::Vector<unsigned_int,4>>
                            ((BasicAllTargetsLoadFS *)this,0,(GLenum)&local_28,
                             (Vector<unsigned_int,_4> *)&stack0xffffffffffffffc8,
                             (Vector<unsigned_int,_4> *)in_R8,in_R9D,1);
          if (bVar1) {
            local_28 = 0x41200000bf800000;
            uStack_20 = 0x453b8000c3480000;
            bVar1 = glcts::(anonymous_namespace)::BasicAllTargetsLoadFS::Read<tcu::Vector<float,4>>
                              ((BasicAllTargetsLoadFS *)this,1,(GLenum)&local_28,
                               (Vector<float,_4> *)&stack0xffffffffffffffc8,in_R8,in_R9D,0xbf800000)
            ;
            if (bVar1) {
              local_28 = 0xaffffffff;
              uStack_20 = 0xbb8ffffff38;
              bVar1 = glcts::(anonymous_namespace)::BasicAllTargetsLoadFS::Read<tcu::Vector<int,4>>
                                ((BasicAllTargetsLoadFS *)this,1,(GLenum)&local_28,
                                 (Vector<int,_4> *)&stack0xffffffffffffffc8,(Vector<int,_4> *)in_R8,
                                 in_R9D,0xffffffff);
              if (bVar1) {
                local_28 = 0xa00000001;
                uStack_20 = 0xbb8000000c8;
                bVar1 = glcts::(anonymous_namespace)::BasicAllTargetsLoadFS::
                        Read<tcu::Vector<unsigned_int,4>>
                                  ((BasicAllTargetsLoadFS *)this,1,(GLenum)&local_28,
                                   (Vector<unsigned_int,_4> *)&stack0xffffffffffffffc8,
                                   (Vector<unsigned_int,_4> *)in_R8,in_R9D,1);
                if (bVar1) {
                  local_28 = 0x41200000bf800000;
                  uStack_20 = 0x453b8000c3480000;
                  bVar1 = glcts::(anonymous_namespace)::BasicAllTargetsLoadFS::
                          Read<tcu::Vector<float,4>>
                                    ((BasicAllTargetsLoadFS *)this,2,(GLenum)&local_28,
                                     (Vector<float,_4> *)&stack0xffffffffffffffc8,in_R8,in_R9D,
                                     0xbf800000);
                  if (bVar1) {
                    local_28 = 0xaffffffff;
                    uStack_20 = 0xbb8ffffff38;
                    bVar1 = glcts::(anonymous_namespace)::BasicAllTargetsLoadFS::
                            Read<tcu::Vector<int,4>>
                                      ((BasicAllTargetsLoadFS *)this,2,(GLenum)&local_28,
                                       (Vector<int,_4> *)&stack0xffffffffffffffc8,
                                       (Vector<int,_4> *)in_R8,in_R9D,0xffffffff);
                    if (bVar1) {
                      local_28 = 0xa00000001;
                      uStack_20 = 0xbb8000000c8;
                      bVar1 = glcts::(anonymous_namespace)::BasicAllTargetsLoadFS::
                              Read<tcu::Vector<unsigned_int,4>>
                                        ((BasicAllTargetsLoadFS *)this,2,(GLenum)&local_28,
                                         (Vector<unsigned_int,_4> *)&stack0xffffffffffffffc8,
                                         (Vector<unsigned_int,_4> *)in_R8,in_R9D,1);
                      if (bVar1) {
                        local_28 = 0x41200000bf800000;
                        uStack_20 = 0x453b8000c3480000;
                        bVar1 = glcts::(anonymous_namespace)::BasicAllTargetsLoadFS::
                                Read<tcu::Vector<float,4>>
                                          ((BasicAllTargetsLoadFS *)this,3,(GLenum)&local_28,
                                           (Vector<float,_4> *)&stack0xffffffffffffffc8,in_R8,in_R9D
                                           ,0xbf800000);
                        if (bVar1) {
                          local_28 = 0xaffffffff;
                          uStack_20 = 0xbb8ffffff38;
                          bVar1 = glcts::(anonymous_namespace)::BasicAllTargetsLoadFS::
                                  Read<tcu::Vector<int,4>>
                                            ((BasicAllTargetsLoadFS *)this,3,(GLenum)&local_28,
                                             (Vector<int,_4> *)&stack0xffffffffffffffc8,
                                             (Vector<int,_4> *)in_R8,in_R9D,0xffffffff);
                          if (bVar1) {
                            local_28 = 0xa00000001;
                            uStack_20 = 0xbb8000000c8;
                            bVar1 = glcts::(anonymous_namespace)::BasicAllTargetsLoadFS::
                                    Read<tcu::Vector<unsigned_int,4>>
                                              ((BasicAllTargetsLoadFS *)this,3,(GLenum)&local_28,
                                               (Vector<unsigned_int,_4> *)&stack0xffffffffffffffc8,
                                               (Vector<unsigned_int,_4> *)in_R8,in_R9D,1);
                            lVar2 = (ulong)bVar1 - 1;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return lVar2;
}

Assistant:

virtual long Run()
	{
		if (!IsVSFSAvailable(0, 4) || !IsSSBInVSFSAvailable(4))
			return NOT_SUPPORTED;
		CreateFullViewportQuad(&m_vao, &m_vbo, NULL);

		if (!Read(T2D, GL_RGBA32F, vec4(-1.0f, 10.0f, -200.0f, 3000.0f), vec4(-1.0f, 10.0f, -200.0f, 3000.0f), GL_RGBA,
				  GL_FLOAT))
			return ERROR;
		if (!Read(T2D, GL_RGBA32I, ivec4(-1, 10, -200, 3000), ivec4(-1, 10, -200, 3000), GL_RGBA_INTEGER, GL_INT))
			return ERROR;
		if (!Read(T2D, GL_RGBA32UI, uvec4(1, 10, 200, 3000), uvec4(1, 10, 200, 3000), GL_RGBA_INTEGER, GL_UNSIGNED_INT))
			return ERROR;
		if (!Read(T3D, GL_RGBA32F, vec4(-1.0f, 10.0f, -200.0f, 3000.0f), vec4(-1.0f, 10.0f, -200.0f, 3000.0f), GL_RGBA,
				  GL_FLOAT))
			return ERROR;
		if (!Read(T3D, GL_RGBA32I, ivec4(-1, 10, -200, 3000), ivec4(-1, 10, -200, 3000), GL_RGBA_INTEGER, GL_INT))
			return ERROR;
		if (!Read(T3D, GL_RGBA32UI, uvec4(1, 10, 200, 3000), uvec4(1, 10, 200, 3000), GL_RGBA_INTEGER, GL_UNSIGNED_INT))
			return ERROR;
		if (!Read(TCM, GL_RGBA32F, vec4(-1.0f, 10.0f, -200.0f, 3000.0f), vec4(-1.0f, 10.0f, -200.0f, 3000.0f), GL_RGBA,
				  GL_FLOAT))
			return ERROR;
		if (!Read(TCM, GL_RGBA32I, ivec4(-1, 10, -200, 3000), ivec4(-1, 10, -200, 3000), GL_RGBA_INTEGER, GL_INT))
			return ERROR;
		if (!Read(TCM, GL_RGBA32UI, uvec4(1, 10, 200, 3000), uvec4(1, 10, 200, 3000), GL_RGBA_INTEGER, GL_UNSIGNED_INT))
			return ERROR;
		if (!Read(T2DA, GL_RGBA32F, vec4(-1.0f, 10.0f, -200.0f, 3000.0f), vec4(-1.0f, 10.0f, -200.0f, 3000.0f), GL_RGBA,
				  GL_FLOAT))
			return ERROR;
		if (!Read(T2DA, GL_RGBA32I, ivec4(-1, 10, -200, 3000), ivec4(-1, 10, -200, 3000), GL_RGBA_INTEGER, GL_INT))
			return ERROR;
		if (!Read(T2DA, GL_RGBA32UI, uvec4(1, 10, 200, 3000), uvec4(1, 10, 200, 3000), GL_RGBA_INTEGER,
				  GL_UNSIGNED_INT))
			return ERROR;

		return NO_ERROR;
	}